

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::main(void)

{
  double dVar1;
  double *pdVar2;
  long *plVar3;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this;
  TPZFMatrix<double> *this_00;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *this_01;
  TPZVec<long> *destinationindex;
  TPZVec<int> NumConnected;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> TestFront;
  TPZVec<long> DestInd3;
  TPZFMatrix<double> KEl3;
  TPZVec<long> DestInd2;
  int j;
  int i;
  TPZFMatrix<double> KEl2;
  TPZVec<long> DestInd1;
  TPZFMatrix<double> KEl1;
  int64_t in_stack_fffffffffffe0158;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>
  *in_stack_fffffffffffe0160;
  int64_t in_stack_fffffffffffe0170;
  int64_t in_stack_fffffffffffe0178;
  TPZFMatrix<double> *in_stack_fffffffffffe0180;
  int64_t in_stack_fffffffffffe0190;
  int64_t in_stack_fffffffffffe0198;
  TPZFMatrix<double> *in_stack_fffffffffffe01a0;
  TPZVec<int> aTStack_1fda8 [398];
  TPZVec<long> *in_stack_fffffffffffe3420;
  TPZFMatrix<double> *in_stack_fffffffffffe3428;
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>
  *in_stack_fffffffffffe3430;
  TPZVec<long> local_228 [5];
  TPZVec<long> local_178;
  int local_158;
  int local_154;
  TPZVec<long> local_c0 [6];
  
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffe01a0,in_stack_fffffffffffe0198,in_stack_fffffffffffe0190);
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 4.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 6.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 6.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 12.0;
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffe0160,in_stack_fffffffffffe0158);
  plVar3 = TPZVec<long>::operator[](local_c0,0);
  *plVar3 = 0;
  plVar3 = TPZVec<long>::operator[](local_c0,1);
  *plVar3 = 1;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffe01a0,in_stack_fffffffffffe0198,in_stack_fffffffffffe0190);
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 4.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = -6.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 2.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 6.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 12.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = -6.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = -12.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 4.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 6.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 12.0;
  for (local_154 = 0; local_154 < 4; local_154 = local_154 + 1) {
    for (local_158 = local_154; local_158 < 4; local_158 = local_158 + 1) {
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,
                          in_stack_fffffffffffe0170);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,
                          in_stack_fffffffffffe0170);
      *pdVar2 = dVar1;
    }
  }
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffe0160,in_stack_fffffffffffe0158);
  plVar3 = TPZVec<long>::operator[](&local_178,0);
  *plVar3 = 0;
  plVar3 = TPZVec<long>::operator[](&local_178,1);
  *plVar3 = 1;
  this = (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
         TPZVec<long>::operator[](&local_178,2);
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x2;
  plVar3 = TPZVec<long>::operator[](&local_178,3);
  *plVar3 = 3;
  TPZFMatrix<double>::TPZFMatrix
            ((TPZFMatrix<double> *)this,(int64_t)plVar3,in_stack_fffffffffffe0190);
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 3.0;
  pdVar2 = TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170)
  ;
  *pdVar2 = 3.0;
  this_00 = (TPZFMatrix<double> *)
            TPZFMatrix<double>::operator()
                      (in_stack_fffffffffffe0180,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170
                      );
  (this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x4008000000000000;
  pdVar2 = TPZFMatrix<double>::operator()
                     (this_00,in_stack_fffffffffffe0178,in_stack_fffffffffffe0170);
  *pdVar2 = 6.0;
  TPZVec<long>::TPZVec((TPZVec<long> *)in_stack_fffffffffffe0160,in_stack_fffffffffffe0158);
  this_01 = (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
            TPZVec<long>::operator[](local_228,0);
  (this_01->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)0x2;
  destinationindex = (TPZVec<long> *)TPZVec<long>::operator[](local_228,1);
  destinationindex->_vptr_TPZVec = (_func_int **)0x3;
  TPZFrontMatrix(this,(int64_t)plVar3);
  TPZVec<int>::TPZVec((TPZVec<int> *)in_stack_fffffffffffe0160,in_stack_fffffffffffe0158);
  for (local_154 = 0; local_154 < 4; local_154 = local_154 + 1) {
    in_stack_fffffffffffe0160 =
         (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
         TPZVec<int>::operator[](aTStack_1fda8,(long)local_154);
    *(int *)&(in_stack_fffffffffffe0160->super_TPZAbstractFrontMatrix<double>).
             super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = 2;
  }
  SetNumElConnected(this_01,(TPZVec<int> *)destinationindex);
  SymbolicAddKel(this_01,destinationindex);
  SymbolicAddKel(this_01,destinationindex);
  SymbolicAddKel(this_01,destinationindex);
  AllocData(in_stack_fffffffffffe0160);
  SetNumElConnected(this_01,(TPZVec<int> *)destinationindex);
  AddKel(in_stack_fffffffffffe3430,in_stack_fffffffffffe3428,in_stack_fffffffffffe3420);
  AddKel(in_stack_fffffffffffe3430,in_stack_fffffffffffe3428,in_stack_fffffffffffe3420);
  AddKel(in_stack_fffffffffffe3430,in_stack_fffffffffffe3428,in_stack_fffffffffffe3420);
  TPZVec<int>::~TPZVec((TPZVec<int> *)in_stack_fffffffffffe0160);
  ~TPZFrontMatrix((TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *)
                  0x1cde704);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffe0160);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1cde71e);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffe0160);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1cde738);
  TPZVec<long>::~TPZVec((TPZVec<long> *)in_stack_fffffffffffe0160);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1cde752);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}